

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag>::
crossover(storage<baryonyx::itm::quadratic_cost_type<float>,_baryonyx::itm::maximize_tag> *this,
         local_context *ctx,bit_array *x,bit_array *first,bit_array *second)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  result_type_conflict rVar4;
  ulong uVar5;
  
  uVar3 = (ulong)(uint)(x->super_bit_array_impl).m_block_size;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      if ((long)(first->super_bit_array_impl).m_block_size <= (long)uVar5) {
        storage<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>::crossover();
LAB_00155752:
        storage<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>::crossover();
      }
      if ((long)(second->super_bit_array_impl).m_block_size <= (long)uVar5) goto LAB_00155752;
      uVar1 = (first->super_bit_array_impl).m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar5];
      uVar2 = (second->super_bit_array_impl).m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar5];
      rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&ctx->crossover_dist,&ctx->rng,&(ctx->crossover_dist)._M_param);
      (x->super_bit_array_impl).m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar5] =
           uVar2 & rVar4 | ~rVar4 & uVar1;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void crossover(local_context& ctx,
                   bit_array& x,
                   const bit_array& first,
                   const bit_array& second)
    {
        const auto block_size = x.block_size();
        for (int i = 0; i != block_size; ++i) {
            const auto x1 = first.block(i);
            const auto x2 = second.block(i);

            x.set_block(i, ((x1 ^ x2) & ctx.crossover_dist(ctx.rng)) ^ x1);
        }
    }